

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O2

void __thiscall
wasm::TranslateToFuzzReader::recombine(wasm::Function*)::Modder::visitExpression(wasm::Expression__
          (void *this,Expression *curr)

{
  bool bVar1;
  int iVar2;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *vec;
  value_type *ppEVar3;
  undefined4 extraout_var;
  
  bVar1 = Random::oneIn((Random *)(*(long *)((long)this + 0xe8) + 0x18),10);
  if (bVar1) {
    bVar1 = canBeArbitrarilyReplaced(*(TranslateToFuzzReader **)((long)this + 0xe8),curr);
    if (bVar1) {
      vec = InsertOrderedMap<wasm::Type,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
            ::operator[]((InsertOrderedMap<wasm::Type,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
                          *)(*(long *)((long)this + 0xe0) + 0xe0),&curr->type);
      if ((vec->super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>)._M_impl
          .super__Vector_impl_data._M_start ==
          (vec->super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>)._M_impl
          .super__Vector_impl_data._M_finish) {
        __assert_fail("!candidates.empty()",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                      ,0x66e,
                      "void wasm::TranslateToFuzzReader::recombine(Function *)::Modder::visitExpression(Expression *)"
                     );
      }
      ppEVar3 = Random::pick<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
                          ((Random *)(*(long *)((long)this + 0xe8) + 0x18),vec);
      iVar2 = ExpressionManipulator::copy
                        ((EVP_PKEY_CTX *)*ppEVar3,*(EVP_PKEY_CTX **)((long)this + 0xd8));
      if (*(Function **)((long)this + 200) != (Function *)0x0) {
        debuginfo::copyOriginalToReplacement
                  ((Expression *)**this,(Expression *)CONCAT44(extraout_var,iVar2),
                   *(Function **)((long)this + 200));
      }
      **this = (Expression *)CONCAT44(extraout_var,iVar2);
    }
  }
  return;
}

Assistant:

void visitExpression(Expression* curr) {
      if (parent.oneIn(10) && parent.canBeArbitrarilyReplaced(curr)) {
        // Replace it!
        auto& candidates = scanner.exprsByType[curr->type];
        assert(!candidates.empty()); // this expression itself must be there
        auto* rep = parent.pick(candidates);
        replaceCurrent(ExpressionManipulator::copy(rep, wasm));
      }
    }